

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageViewPrivate::relayoutChildren(PageViewPrivate *this,QRect *r)

{
  PageViewPrivate *this_00;
  ulong uVar1;
  uint uVar2;
  
  QWidget::resize((QSize *)this->viewport);
  this_00 = (PageViewPrivate *)this->viewport;
  QWidget::move((QPoint *)this_00);
  uVar2 = (uint)(this->pages).d.size;
  if (0 < (int)uVar2) {
    uVar1 = 0;
    do {
      layoutPage(this_00,(this->pages).d.ptr[uVar1],r);
      uVar1 = uVar1 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar1);
  }
  layoutControl(this,r);
  return;
}

Assistant:

void
PageViewPrivate::relayoutChildren( const QRect & r )
{
	viewport->resize( r.size() );

	viewport->move( r.topLeft() );

	for( int i = 0, iMax = pages.count(); i < iMax; ++i )
		layoutPage( pages.at( i ), r );

	layoutControl( r );
}